

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void __thiscall ParallelForLoop1D::RunStep(ParallelForLoop1D *this,unique_lock<std::mutex> *lock)

{
  long lVar1;
  _func_int **pp_Var2;
  ParallelJob *pPVar3;
  ParallelJob *pPVar4;
  code *pcVar5;
  byte bVar6;
  int iVar7;
  unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> uVar8;
  undefined8 *extraout_RDX;
  unique_lock<std::mutex> *puVar9;
  unique_lock<std::mutex> *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auStack_d0 [32];
  undefined **appuStack_b0 [2];
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  int iStack_98;
  undefined1 uStack_94;
  undefined8 uStack_90;
  undefined8 uStack_88;
  code *pcStack_80;
  undefined8 uStack_78;
  unique_lock<std::mutex> *puStack_70;
  unique_lock<std::mutex> *puStack_68;
  undefined4 uStack_60;
  ParallelForLoop1D *pPStack_58;
  long lStack_50;
  unique_lock<std::mutex> *puStack_48;
  code *pcStack_40;
  long local_30;
  long local_28;
  
  lVar1 = this->nextIndex;
  pp_Var2 = (this->super_ParallelJob)._vptr_ParallelJob;
  lVar13 = this->chunkSize + lVar1;
  if (this->maxIndex < lVar13) {
    lVar13 = this->maxIndex;
  }
  this->nextIndex = lVar13;
  pcStack_40 = (code *)0x1044c1;
  puVar9 = lock;
  iVar7 = (*pp_Var2[3])();
  if ((char)iVar7 == '\0') {
    pPVar3 = (this->super_ParallelJob).prev;
    pPVar4 = (this->super_ParallelJob).next;
    uVar8 = threadPool;
    if (pPVar3 != (ParallelJob *)0x0) {
      uVar8._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
      super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
      super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl =
           (__uniq_ptr_data<ThreadPool,_std::default_delete<ThreadPool>,_true,_true>)
           (__uniq_ptr_data<ThreadPool,_std::default_delete<ThreadPool>,_true,_true>)&pPVar3->next;
    }
    *(ParallelJob **)
     uVar8._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
     super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
     super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl = pPVar4;
    if (pPVar4 != (ParallelJob *)0x0) {
      pPVar4->prev = pPVar3;
    }
    (this->super_ParallelJob).removed = true;
  }
  pcStack_40 = (code *)0x1044f7;
  puVar10 = lock;
  std::unique_lock<std::mutex>::unlock(lock);
  local_30 = lVar13;
  local_28 = lVar1;
  if ((this->func).super__Function_base._M_manager == (_Manager_type)0x0) {
    pcStack_40 = ParallelFor;
    std::__throw_bad_function_call();
    uVar8 = threadPool;
    if ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>)
        threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
        super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
        super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>)0x0) {
      lVar11 = 8;
    }
    else {
      lVar11 = (long)(((ulong)(*(int *)((long)threadPool._M_t.
                                              super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>
                                              .super__Head_base<0UL,_ThreadPool_*,_false>.
                                              _M_head_impl + 0x68) -
                               *(int *)((long)threadPool._M_t.
                                              super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>
                                              .super__Head_base<0UL,_ThreadPool_*,_false>.
                                              _M_head_impl + 0x60) & 0xfffffff8) << 0x20) +
                     0x800000000) >> 0x20;
    }
    lVar11 = ((long)puVar9 - (long)puVar10) / lVar11;
    auStack_d0._16_8_ = 0;
    auStack_d0._24_8_ = 0;
    uStack_78 = extraout_RDX[3];
    lVar12 = 1;
    if (1 < lVar11) {
      lVar12 = lVar11;
    }
    pcVar5 = (code *)extraout_RDX[2];
    if (pcVar5 != (code *)0x0) {
      auStack_d0._16_8_ = *extraout_RDX;
      auStack_d0._24_8_ = extraout_RDX[1];
      extraout_RDX[2] = 0;
      extraout_RDX[3] = 0;
    }
    appuStack_b0[1] = (undefined **)0x0;
    uStack_a0._0_1_ = (condition_variable)0x0;
    uStack_a0._1_4_ = 0;
    uStack_9b = 0;
    iStack_98 = 0;
    uStack_94 = 0;
    appuStack_b0[0] = &PTR__ParallelForLoop1D_00109cc0;
    uStack_90 = 0;
    uStack_88 = 0;
    pcStack_80 = (code *)0x0;
    if (pcVar5 != (code *)0x0) {
      uStack_90 = auStack_d0._16_8_;
      uStack_88 = auStack_d0._24_8_;
      pcStack_80 = pcVar5;
    }
    uStack_60 = (undefined4)lVar12;
    puStack_70 = puVar10;
    puStack_68 = puVar9;
    pPStack_58 = this;
    lStack_50 = lVar13;
    puStack_48 = lock;
    pcStack_40 = (code *)lVar1;
    ThreadPool::AddToJobList
              ((ThreadPool *)auStack_d0,
               (ParallelJob *)
               uVar8._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>._M_t.
               super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
               super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl);
    while (bVar6 = (*(code *)((__pthread_internal_list *)((long)appuStack_b0[0] + 0x10))->__next)
                             (appuStack_b0), (bVar6 | iStack_98 != 0) == 1) {
      ThreadPool::WorkOrWait
                ((ThreadPool *)
                 threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>
                 ._M_t.super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
                 super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl,
                 (unique_lock<std::mutex> *)auStack_d0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)auStack_d0);
    appuStack_b0[0] = &PTR__ParallelForLoop1D_00109cc0;
    if (pcStack_80 != (code *)0x0) {
      (*pcStack_80)(&uStack_90,&uStack_90,3);
    }
    return;
  }
  pcStack_40 = (code *)0x104519;
  (*(this->func)._M_invoker)((_Any_data *)&this->func,&local_28,&local_30);
  return;
}

Assistant:

void ParallelForLoop1D::RunStep(std::unique_lock<std::mutex> *lock) {
    // Find the set of loop iterations to run next
    int64_t indexStart = nextIndex;
    int64_t indexEnd = std::min(indexStart + chunkSize, maxIndex);

    // Update _loop_ to reflect iterations this thread will run
    nextIndex = indexEnd;

    if (!HaveWork())
        threadPool->RemoveFromJobList(this);

    lock->unlock();

    // Run loop indices in _[indexStart, indexEnd)_
    func(indexStart, indexEnd);
}